

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O2

size_type find(string *text,string *pattern,size_type begin,bool sensitive)

{
  ulong uVar1;
  pointer pcVar2;
  pointer pcVar3;
  int iVar4;
  int iVar5;
  size_type sVar6;
  undefined3 in_register_00000009;
  pointer pcVar7;
  size_t i;
  size_type sVar8;
  size_type sStack_40;
  
  if (CONCAT31(in_register_00000009,sensitive) != 0) {
    sVar6 = std::__cxx11::string::find((string *)text,(ulong)pattern);
    return sVar6;
  }
  sVar6 = pattern->_M_string_length;
  if (sVar6 == 0) {
    sStack_40 = 0;
  }
  else {
    uVar1 = text->_M_string_length;
    sStack_40 = 0xffffffffffffffff;
    if (begin < uVar1) {
      pcVar2 = (pattern->_M_dataplus)._M_p;
      pcVar3 = (text->_M_dataplus)._M_p;
      for (pcVar7 = pcVar3 + begin; pcVar7 <= pcVar3 + (uVar1 - sVar6); pcVar7 = pcVar7 + 1) {
        sVar8 = 0;
        do {
          if (sVar6 == sVar8) {
            return (long)pcVar7 - (long)pcVar3;
          }
          iVar4 = tolower((int)pcVar7[sVar8]);
          iVar5 = tolower((int)pcVar2[sVar8]);
          sVar8 = sVar8 + 1;
        } while (iVar4 == iVar5);
      }
      sStack_40 = 0xffffffffffffffff;
    }
  }
  return sStack_40;
}

Assistant:

std::string::size_type find (
  const std::string& text,
  const std::string& pattern,
  std::string::size_type begin,
  bool sensitive)
{
  // Implement a sensitive find, which is really just a loop withing a loop,
  // comparing lower-case versions of each character in turn.
  if (!sensitive)
  {
    // Handle empty pattern.
    const char* p = pattern.c_str ();
    size_t len = pattern.length ();
    if (len == 0)
      return 0;

    // Handle bad begin.
    if (begin >= text.length ())
      return std::string::npos;

    // Evaluate these once, for performance reasons.
    const char* start = text.c_str ();
    const char* t = start + begin;
    const char* end = start + text.size ();

    for (; t <= end - len; ++t)
    {
      int diff = 0;
      for (size_t i = 0; i < len; ++i)
        if ((diff = tolower (t[i]) - tolower (p[i])))
          break;

      // diff == 0 means there was no break from the loop, which only occurs
      // when a difference is detected.  Therefore, the loop terminated, and
      // diff is zero.
      if (diff == 0)
        return t - start;
    }

    return std::string::npos;
  }

  // Otherwise, just use std::string::find.
  return text.find (pattern, begin);
}